

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
::emplace_new_key<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>
          (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<slang::parsing::TokenKind,_slang::parsing::Token> *key)

{
  undefined8 *puVar1;
  TokenKind TVar2;
  Info *pIVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
  sVar6;
  long lVar7;
  EntryPointer psVar8;
  TokenKind TVar9;
  EntryPointer psVar10;
  char cVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
  pVar14;
  Token __tmp_1;
  pair<slang::parsing::TokenKind,_slang::parsing::Token> local_48;
  undefined8 local_28;
  Info *pIStack_20;
  
  if ((*(long *)(this + 0x10) != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
       )distance_from_desired)) {
    psVar8 = (EntryPointer)(*(long *)(this + 0x20) + 1);
    auVar12._8_4_ = (int)((ulong)psVar8 >> 0x20);
    auVar12._0_8_ = psVar8;
    auVar12._12_4_ = 0x45300000;
    lVar7 = *(long *)(this + 0x10) + 1;
    auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar13._0_8_ = lVar7;
    auVar13._12_4_ = 0x45300000;
    if ((auVar12._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)psVar8) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar13._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) {
      cVar11 = current_entry->distance_from_desired;
      if (cVar11 < '\0') {
        *(Info **)((long)&current_entry->field_1 + 0x10) = (key->second).info;
        uVar4 = *(undefined8 *)&key->second;
        *(undefined8 *)&current_entry->field_1 = *(undefined8 *)key;
        *(undefined8 *)((long)&current_entry->field_1 + 8) = uVar4;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        pIVar3 = (key->second).info;
        uVar4 = *(undefined8 *)&key->second;
        local_48.first = (TokenKind)*(undefined8 *)key;
        local_48._2_6_ = SUB86((ulong)*(undefined8 *)key >> 0x10,0);
        current_entry->distance_from_desired = distance_from_desired;
        TVar9 = (current_entry->field_1).value.first;
        (current_entry->field_1).value.first = local_48.first;
        uVar5 = *(undefined8 *)((long)&current_entry->field_1 + 8);
        local_48.second.info = *(Info **)((long)&current_entry->field_1 + 0x10);
        local_48.second.kind = (TokenKind)uVar5;
        local_48.second._2_4_ = SUB84((ulong)uVar5 >> 0x10,0);
        local_48.second.rawLen._2_2_ = (undefined2)((ulong)uVar5 >> 0x30);
        *(undefined8 *)((long)&current_entry->field_1 + 8) = uVar4;
        *(Info **)((long)&current_entry->field_1 + 0x10) = pIVar3;
        sVar6 = (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
                 )(cVar11 + '\x01');
        psVar8 = current_entry + 1;
        cVar11 = current_entry[1].distance_from_desired;
        psVar10 = current_entry;
        if (-1 < cVar11) {
          puVar1 = (undefined8 *)((long)&current_entry->field_1 + 8);
          do {
            psVar10 = psVar8;
            if (cVar11 < (char)sVar6) {
              psVar10->distance_from_desired = (int8_t)sVar6;
              TVar2 = (psVar10->field_1).value.first;
              (psVar10->field_1).value.first = TVar9;
              uVar5 = CONCAT26(local_48.second.rawLen._2_2_,
                               CONCAT42(local_48.second._2_4_,local_48.second.kind));
              uVar4 = *(undefined8 *)((long)&psVar10->field_1 + 8);
              pIVar3 = *(Info **)((long)&psVar10->field_1 + 0x10);
              local_48.second.kind = (TokenKind)uVar4;
              local_48.second._2_4_ = SUB84((ulong)uVar4 >> 0x10,0);
              local_48.second.rawLen._2_2_ = (undefined2)((ulong)uVar4 >> 0x30);
              *(undefined8 *)((long)&psVar10->field_1 + 8) = uVar5;
              *(Info **)((long)&psVar10->field_1 + 0x10) = local_48.second.info;
              sVar6 = (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
                       )(cVar11 + '\x01');
              TVar9 = TVar2;
              local_48.second.info = pIVar3;
            }
            else {
              sVar6 = (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
                       )((char)sVar6 + '\x01');
              if (sVar6 == this[0x19]) {
                local_48.first = (current_entry->field_1).value.first;
                (current_entry->field_1).value.first = TVar9;
                local_28 = CONCAT26(local_48.second.rawLen._2_2_,
                                    CONCAT42(local_48.second._2_4_,local_48.second.kind));
                pIStack_20 = local_48.second.info;
                uVar4 = *puVar1;
                pIVar3 = *(Info **)((long)&current_entry->field_1 + 0x10);
                local_48.second.kind = (TokenKind)uVar4;
                local_48.second._2_4_ = SUB84((ulong)uVar4 >> 0x10,0);
                local_48.second.rawLen._2_2_ = (undefined2)((ulong)uVar4 >> 0x30);
                *puVar1 = local_28;
                *(Info **)((long)&current_entry->field_1 + 0x10) = local_48.second.info;
                key = &local_48;
                local_48.second.info = pIVar3;
                goto LAB_00332f43;
              }
            }
            cVar11 = psVar10[1].distance_from_desired;
            psVar8 = psVar10 + 1;
          } while (-1 < cVar11);
        }
        *(Info **)((long)&psVar10[1].field_1 + 0x10) = local_48.second.info;
        psVar10[1].field_1.value.first = TVar9;
        *(ulong *)((long)&psVar10[1].field_1 + 2) = CONCAT26(local_48.second.kind,local_48._2_6_);
        *(undefined4 *)((long)&psVar10[1].field_1 + 10) = local_48.second._2_4_;
        *(undefined2 *)((long)&psVar10[1].field_1.value.second.rawLen + 2) =
             local_48.second.rawLen._2_2_;
        psVar8->distance_from_desired = (int8_t)sVar6;
      }
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
      pVar14._9_7_ = (int7)((ulong)psVar8 >> 8);
      pVar14.second = true;
      pVar14.first.current = current_entry;
      return pVar14;
    }
  }
LAB_00332f43:
  sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
  ::grow((sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
          *)this);
  pVar14 = emplace<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>(this,key);
  return pVar14;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }